

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

APInt __thiscall llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long *in_RSI;
  APInt AVar5;
  ArrayRef<unsigned_long> bigVal;
  uint64_t words [2];
  undefined8 extraout_RDX;
  
  if ((undefined1 *)*in_RSI != semX87DoubleExtended) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semX87DoubleExtended",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xaf0,"APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const"
                 );
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  uVar2 = bVar1 & 7;
  if (uVar2 == 3 || (bVar1 & 6) == 0) {
    if (uVar2 == 3) {
      uVar3 = 0;
      words[0] = 0;
    }
    else {
      if (uVar2 == 1) {
        words[0] = *(uint64_t *)in_RSI[1];
      }
      else {
        if ((bVar1 & 7) != 0) {
          __assert_fail("category == fcNaN && \"Unknown category\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb01,
                        "APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const")
          ;
        }
        words[0] = 0x8000000000000000;
      }
      uVar3 = 0x7fff;
    }
  }
  else {
    lVar4 = (long)(short)in_RSI[2] + 0x3fff;
    words[0] = *(uint64_t *)in_RSI[1];
    uVar2 = (uint)(words[0] >> 0x3f);
    if (lVar4 != 1) {
      uVar2 = (uint)lVar4;
    }
    uVar3 = (ulong)(uVar2 & 0x7fff);
  }
  words[1] = (bVar1 & 8) << 0xc | uVar3;
  bigVal.Length = 2;
  bigVal.Data = words;
  APInt::APInt((APInt *)this,0x50,bigVal);
  AVar5._8_8_ = extraout_RDX;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semX87DoubleExtended);
  assert(partCount()==2);

  uint64_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+16383; //bias
    mysignificand = significandParts()[0];
    if (myexponent==1 && !(mysignificand & 0x8000000000000000ULL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7fff;
    mysignificand = 0x8000000000000000ULL;
  } else {
    assert(category == fcNaN && "Unknown category");
    myexponent = 0x7fff;
    mysignificand = significandParts()[0];
  }

  uint64_t words[2];
  words[0] = mysignificand;
  words[1] =  ((uint64_t)(sign & 1) << 15) |
              (myexponent & 0x7fffLL);
  return APInt(80, words);
}